

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O1

void simd::ConvertToRgb(Image *in,uint32_t startXIn,uint32_t startYIn,Image *out,uint32_t startXOut,
                       uint32_t startYOut,uint32_t width,uint32_t height,SIMDType simdType)

{
  undefined1 *puVar1;
  undefined1 auVar2 [16];
  undefined1 uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 *puVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 (*pauVar12) [16];
  undefined1 (*pauVar13) [16];
  uint uVar14;
  SIMDType SVar15;
  undefined1 *puVar16;
  undefined1 (*pauVar17) [16];
  undefined2 *puVar18;
  uint uVar19;
  undefined1 (*pauVar20) [16];
  
  do {
    do {
      SVar15 = simdType;
      if (SVar15 < 4) {
        uVar19 = *(uint *)(&DAT_001e55e0 + (ulong)SVar15 * 4);
      }
      else {
        uVar19 = 0;
      }
      if (SVar15 == neon_function) {
        uVar19 = 8;
      }
      simdType = sse_function;
    } while (SVar15 == avx_function);
    if (SVar15 == cpu_function) break;
    if (uVar19 <= width) {
      Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
                (in,startXIn,startYIn,out,startXOut,startYOut,width,height);
      Image_Function::VerifyRGBImage<PenguinV_Image::ImageTemplate<unsigned_char>>(out);
      auVar11 = _DAT_001e55b0;
      auVar10 = _DAT_001e55a0;
      auVar9 = _DAT_001e5590;
      if (in->_colorCount == '\x03') {
        Image_Function::Copy(in,startXIn,startYIn,out,startXOut,startYOut,width,height);
        return;
      }
      if (SVar15 != sse_function) {
        return;
      }
      uVar4 = out->_rowSize;
      if (height * uVar4 == 0) {
        return;
      }
      uVar5 = in->_rowSize;
      uVar6 = (ulong)width / (ulong)uVar19;
      pauVar12 = (undefined1 (*) [16])
                 (out->_data + (ulong)(startXOut * 3) + (ulong)(startYOut * uVar4));
      pauVar13 = (undefined1 (*) [16])(in->_data + (ulong)startXIn + (ulong)(startYIn * uVar5));
      uVar14 = (int)uVar6 * uVar19;
      puVar8 = *pauVar12;
      do {
        if (uVar19 <= width) {
          pauVar17 = pauVar12;
          pauVar20 = pauVar13;
          do {
            auVar2 = *pauVar20;
            auVar7 = vpshufb_avx(auVar2,auVar9);
            *pauVar17 = auVar7;
            auVar7 = vpshufb_avx(auVar2,auVar10);
            pauVar17[1] = auVar7;
            auVar2 = vpshufb_avx(auVar2,auVar11);
            pauVar17[2] = auVar2;
            pauVar17 = pauVar17 + 3;
            pauVar20 = pauVar20 + 1;
          } while (pauVar20 != pauVar13 + uVar6);
        }
        if (uVar14 != width) {
          puVar16 = *pauVar13 + uVar14;
          puVar1 = puVar16 + (ulong)width % (ulong)uVar19;
          puVar18 = (undefined2 *)(*pauVar12 + uVar14 * 3);
          do {
            uVar3 = *puVar16;
            *(undefined1 *)(puVar18 + 1) = uVar3;
            *puVar18 = CONCAT11(uVar3,uVar3);
            puVar18 = (undefined2 *)((long)puVar18 + 3);
            puVar16 = puVar16 + 1;
          } while (puVar16 != puVar1);
        }
        pauVar12 = (undefined1 (*) [16])(*pauVar12 + uVar4);
        pauVar13 = (undefined1 (*) [16])(*pauVar13 + uVar5);
      } while (pauVar12 != (undefined1 (*) [16])(puVar8 + height * uVar4));
      return;
    }
  } while (SVar15 == avx_function);
  Image_Function::ConvertToRgb(in,startXIn,startYIn,out,startXOut,startYOut,width,height);
  return;
}

Assistant:

void ConvertToRgb( const Image & in, uint32_t startXIn, uint32_t startYIn, Image & out, uint32_t startXOut, uint32_t startYOut,
                       uint32_t width, uint32_t height, SIMDType simdType )
    {
        uint32_t simdSize = getSimdSize( simdType );
        if( simdType == neon_function ) // for neon, because the algorithm used work with packet of 64 bit
            simdSize = 8u;
        
        const uint8_t colorCount = RGB;

        if( (simdType == cpu_function) || (simdType == avx_function) || (width < simdSize) ) {
            AVX_CODE( ConvertToRgb( in, startXIn, startYIn, out, startXOut, startYOut, width, height, sse_function ); )

            Image_Function::ConvertToRgb( in, startXIn, startYIn, out, startXOut, startYOut, width, height );
            return;
        }

        Image_Function::ParameterValidation( in, startXIn, startYIn, out, startXOut, startYOut, width, height );
        Image_Function::VerifyRGBImage     ( out );

        if( in.colorCount() == RGB ) {
            Image_Function::Copy( in, startXIn, startYIn, out, startXOut, startYOut, width, height );
            return;
        }

        const uint32_t rowSizeIn  = in.rowSize();
        const uint32_t rowSizeOut = out.rowSize();

        const uint8_t * inY  = in.data()  + startYIn  * rowSizeIn  + startXIn;
        uint8_t       * outY = out.data() + startYOut * rowSizeOut + startXOut * colorCount;

        const uint8_t * outYEnd = outY + height * rowSizeOut;

        const uint32_t simdWidth = width / simdSize;
        const uint32_t totalSimdWidth = simdWidth * simdSize;
        const uint32_t nonSimdWidth = width - totalSimdWidth;

        SSSE3_CODE( sse::ConvertToRgb( outY, outYEnd, inY, rowSizeOut, rowSizeIn, colorCount, simdWidth, totalSimdWidth, nonSimdWidth ); )
        NEON_CODE( neon::ConvertToRgb( outY, outYEnd, inY, rowSizeOut, rowSizeIn, colorCount, simdWidth, totalSimdWidth, nonSimdWidth ); )
    }